

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

TIFFReadDirEntryErr TIFFReadDirEntrySlong(TIFF *tif,TIFFDirEntry *direntry,int32_t *value)

{
  TIFFReadDirEntryErr TVar1;
  uint uVar2;
  ulong uVar3;
  uint16_t m;
  undefined8 local_20;
  
  if (direntry->tdir_count != 1) {
    return TIFFReadDirEntryErrCount;
  }
  TVar1 = TIFFReadDirEntryErrType;
  switch(direntry->tdir_type) {
  case 1:
    uVar2 = (uint)*(byte *)&direntry->tdir_offset;
    break;
  default:
    goto switchD_002947fe_caseD_2;
  case 3:
    local_20._0_2_ = (direntry->tdir_offset).toff_short;
    if ((char)tif->tif_flags < '\0') {
      TIFFSwabShort((uint16_t *)&local_20);
    }
    uVar2 = (uint)(uint16_t)local_20;
    break;
  case 4:
    uVar2 = (direntry->tdir_offset).toff_long;
    local_20._0_2_ = (uint16_t)uVar2;
    local_20._2_2_ = (undefined2)(uVar2 >> 0x10);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_20);
      uVar2 = CONCAT22(local_20._2_2_,(uint16_t)local_20);
    }
    TVar1 = uVar2 >> 0x1d & TIFFReadDirEntryErrRange;
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    *value = uVar2;
    return TIFFReadDirEntryErrOk;
  case 6:
    uVar2 = (uint)*(char *)&direntry->tdir_offset;
    break;
  case 8:
    local_20._0_2_ = (direntry->tdir_offset).toff_short;
    if ((char)tif->tif_flags < '\0') {
      TIFFSwabShort((uint16_t *)&local_20);
    }
    uVar2 = (uint)(short)(uint16_t)local_20;
    break;
  case 9:
    *value = (direntry->tdir_offset).toff_long;
    if ((tif->tif_flags & 0x80) == 0) {
      return TIFFReadDirEntryErrOk;
    }
    TIFFSwabLong((uint32_t *)value);
    return TIFFReadDirEntryErrOk;
  case 0x10:
    TVar1 = TIFFReadDirEntryCheckedLong8(tif,direntry,&local_20);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    uVar3 = CONCAT44(local_20._4_4_,CONCAT22(local_20._2_2_,(uint16_t)local_20));
    if (0x7fffffff < uVar3) {
      return TIFFReadDirEntryErrRange;
    }
    goto LAB_00294899;
  case 0x11:
    TVar1 = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_20);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    uVar3 = CONCAT44(local_20._4_4_,CONCAT22(local_20._2_2_,(uint16_t)local_20));
    if ((long)CONCAT22(local_20._2_2_,(uint16_t)local_20) != uVar3) {
      return TIFFReadDirEntryErrRange;
    }
LAB_00294899:
    *value = (int32_t)uVar3;
    goto LAB_002948f1;
  }
  *value = uVar2;
LAB_002948f1:
  TVar1 = TIFFReadDirEntryErrOk;
switchD_002947fe_caseD_2:
  return TVar1;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySlong(TIFF *tif, TIFFDirEntry *direntry, int32_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
        {
            uint16_t m;
            TIFFReadDirEntryCheckedShort(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
        {
            int16_t m;
            TIFFReadDirEntryCheckedSshort(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSlongLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
            TIFFReadDirEntryCheckedSlong(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSlongLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSlongSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}